

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.c
# Opt level: O1

int xmlNanoHTTPRead(void *ctx,void *dest,int len)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  xmlNanoHTTPCtxtPtr ctxt;
  
  iVar5 = -1;
  if ((dest != (void *)0x0 && ctx != (void *)0x0) && (iVar5 = 0, 0 < len)) {
    if (*(int *)((long)ctx + 0xa8) == 1) {
      lVar3 = *(long *)((long)ctx + 0xa0);
      if (lVar3 != 0) {
        *(void **)(lVar3 + 0x18) = dest;
        *(int *)(lVar3 + 0x20) = len;
        *(int *)(lVar3 + 8) = *(int *)((long)ctx + 0x50) - *(int *)((long)ctx + 0x58);
        iVar5 = 0;
        do {
          if ((*(int *)(*(long *)((long)ctx + 0xa0) + 0x20) == 0) ||
             ((*(int *)(*(long *)((long)ctx + 0xa0) + 8) == 0 &&
              (iVar2 = xmlNanoHTTPRecv((xmlNanoHTTPCtxtPtr)ctx), iVar2 < 1)))) break;
          lVar3 = *(long *)((long)ctx + 0x58);
          iVar4 = (*(int *)((long)ctx + 0x50) - iVar5) - (int)lVar3;
          plVar1 = *(long **)((long)ctx + 0xa0);
          *(int *)(plVar1 + 1) = iVar4;
          *plVar1 = lVar3 + iVar5;
          iVar2 = inflate(plVar1,0);
          iVar5 = (iVar4 - *(int *)(*(long *)((long)ctx + 0xa0) + 8)) + iVar5;
        } while (iVar2 == 0);
        *(long *)((long)ctx + 0x58) = *(long *)((long)ctx + 0x58) + (long)iVar5;
        iVar5 = len - *(int *)(*(long *)((long)ctx + 0xa0) + 0x20);
      }
    }
    else {
      do {
        if ((long)(ulong)(uint)len <= *(long *)((long)ctx + 0x50) - *(long *)((long)ctx + 0x58))
        break;
        iVar5 = xmlNanoHTTPRecv((xmlNanoHTTPCtxtPtr)ctx);
      } while (0 < iVar5);
      lVar3 = *(long *)((long)ctx + 0x50) - (long)*(void **)((long)ctx + 0x58);
      iVar5 = len;
      if (lVar3 < (long)(ulong)(uint)len) {
        iVar5 = (int)lVar3;
      }
      memcpy(dest,*(void **)((long)ctx + 0x58),(long)iVar5);
      *(long *)((long)ctx + 0x58) = *(long *)((long)ctx + 0x58) + (long)iVar5;
    }
  }
  return iVar5;
}

Assistant:

int
xmlNanoHTTPRead(void *ctx, void *dest, int len) {
    xmlNanoHTTPCtxtPtr ctxt = (xmlNanoHTTPCtxtPtr) ctx;
#ifdef LIBXML_ZLIB_ENABLED
    int bytes_read = 0;
    int orig_avail_in;
    int z_ret;
#endif

    if (ctx == NULL) return(-1);
    if (dest == NULL) return(-1);
    if (len <= 0) return(0);

#ifdef LIBXML_ZLIB_ENABLED
    if (ctxt->usesGzip == 1) {
        if (ctxt->strm == NULL) return(0);

        ctxt->strm->next_out = dest;
        ctxt->strm->avail_out = len;
	ctxt->strm->avail_in = ctxt->inptr - ctxt->inrptr;

        while (ctxt->strm->avail_out > 0 &&
	       (ctxt->strm->avail_in > 0 || xmlNanoHTTPRecv(ctxt) > 0)) {
            orig_avail_in = ctxt->strm->avail_in =
			    ctxt->inptr - ctxt->inrptr - bytes_read;
            ctxt->strm->next_in = BAD_CAST (ctxt->inrptr + bytes_read);

            z_ret = inflate(ctxt->strm, Z_NO_FLUSH);
            bytes_read += orig_avail_in - ctxt->strm->avail_in;

            if (z_ret != Z_OK) break;
	}

        ctxt->inrptr += bytes_read;
        return(len - ctxt->strm->avail_out);
    }
#endif

    while (ctxt->inptr - ctxt->inrptr < len) {
        if (xmlNanoHTTPRecv(ctxt) <= 0) break;
    }
    if (ctxt->inptr - ctxt->inrptr < len)
        len = ctxt->inptr - ctxt->inrptr;
    memcpy(dest, ctxt->inrptr, len);
    ctxt->inrptr += len;
    return(len);
}